

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtrace.h
# Opt level: O3

ssize_t __thiscall
booster::details::trace_manip::write(trace_manip *this,int __fd,void *__buf,size_t __n)

{
  backtrace *pbVar1;
  void **ppvVar2;
  void **ppvVar3;
  undefined4 in_register_00000034;
  
  pbVar1 = this->tr_;
  if (pbVar1 != (backtrace *)0x0) {
    ppvVar2 = (pbVar1->frames_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppvVar3 = (pbVar1->frames_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppvVar2 != ppvVar3) {
      booster::stack_trace::write_symbols
                (ppvVar2,(int)((ulong)((long)ppvVar3 - (long)ppvVar2) >> 3),
                 (ostream *)CONCAT44(in_register_00000034,__fd));
    }
  }
  return (ssize_t)(ostream *)CONCAT44(in_register_00000034,__fd);
}

Assistant:

std::ostream &write(std::ostream &out) const
            {
                if(tr_)
                    tr_->trace(out);
                return out;
            }